

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets_tests.cpp
# Opt level: O2

void __thiscall timeoffsets_tests::timeoffsets_warning::test_method(timeoffsets_warning *this)

{
  readonly_property<bool> rVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> __l;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar5;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  value_type local_f0;
  char *local_e8;
  assertion_result local_e0;
  value_type *local_c8;
  allocator_type local_b9;
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  local_b8;
  assertion_result local_a0;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  lazy_ostream local_68;
  undefined1 *local_58;
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *p_Stack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x40;
  file.m_begin = (iterator)&local_78;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_88,msg);
  local_58 = (undefined1 *)0xfffffffffffff8f8;
  p_Stack_50 = (_Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                *)0x0;
  local_68._vptr_lazy_ostream = (_func_int **)0xfffffffffffff1f0;
  local_68._8_8_ = 0xfffffffffffff6a0;
  local_48 = 600;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_68;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)&local_b8,__l,&local_b9);
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       IsWarningRaised((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                        *)&local_b8);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c8 = &local_f0;
  local_f0.__r = 0xc53874;
  local_e8 = "";
  local_e0.m_message.px = (element_type *)((ulong)local_e0.m_message.px & 0xffffffffffffff00);
  local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_f8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,(lazy_ostream *)&local_e0,1,0,WARN,_cVar5,(size_t)&local_100,0x40);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~_Vector_base(&local_b8);
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x41;
  file_00.m_begin = (iterator)&local_110;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_120,
             msg_00);
  local_f0.__r = 0x294;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)&local_a0,5,&local_f0,&local_b9);
  rVar1.super_class_property<bool>.value =
       (class_property<bool>)
       IsWarningRaised((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                        *)&local_a0);
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0xc538ad;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc538c8;
  local_68._8_8_ = local_68._8_8_ & 0xffffffffffffff00;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_128 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  p_Stack_50 = &local_b8;
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar1.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_68,1,0,WARN,_cVar5,(size_t)&local_130,0x41);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~_Vector_base((_Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_a0);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x43;
  file_01.m_begin = (iterator)&local_140;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
             msg_01);
  local_f0.__r = 0xe10;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)&local_a0,4,&local_f0,&local_b9);
  bVar2 = IsWarningRaised((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                           *)&local_a0);
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0xc538c9;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc538e5;
  local_68._8_8_ = local_68._8_8_ & 0xffffffffffffff00;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_158 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  p_Stack_50 = &local_b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_68,1,0,WARN,_cVar5,(size_t)&local_160,0x43);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~_Vector_base((_Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_a0);
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x44;
  file_02.m_begin = (iterator)&local_170;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_180,
             msg_02);
  local_f0.__r = 0xb4;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)&local_a0,100,&local_f0,&local_b9);
  bVar2 = IsWarningRaised((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                           *)&local_a0);
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0xc538e6;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc53903;
  local_68._8_8_ = local_68._8_8_ & 0xffffffffffffff00;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_58 = boost::unit_test::lazy_ostream::inst;
  p_Stack_50 = &local_b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_68,1,0,WARN,0xc53791,(size_t)&stack0xfffffffffffffe70,0x44);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~_Vector_base((_Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(timeoffsets_warning)
{
    BOOST_CHECK(IsWarningRaised({{-60min, -40min, -30min, 0min, 10min}}));
    BOOST_CHECK(IsWarningRaised({5, 11min}));

    BOOST_CHECK(!IsWarningRaised({4, 60min}));
    BOOST_CHECK(!IsWarningRaised({100, 3min}));
}